

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parse.cc
# Opt level: O1

bool __thiscall anon_unknown.dwarf_3dd9::Reactor::arrayItem(Reactor *this,JSON *value)

{
  bool bVar1;
  int iVar2;
  char *j;
  string n;
  string local_30;
  
  j = "array item: ";
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"array item: ",0xc);
  printItem((Reactor *)value,(JSON *)j);
  local_30._M_string_length = 0;
  local_30.field_2._M_local_buf[0] = '\0';
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  bVar1 = JSON::getString(value,&local_30);
  if (bVar1) {
    iVar2 = std::__cxx11::string::compare((char *)&local_30);
    if (iVar2 == 0) {
      bVar1 = false;
      goto LAB_0011d8e3;
    }
  }
  bVar1 = true;
LAB_0011d8e3:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,
                    CONCAT71(local_30.field_2._M_allocated_capacity._1_7_,
                             local_30.field_2._M_local_buf[0]) + 1);
  }
  return bVar1;
}

Assistant:

bool
Reactor::arrayItem(JSON const& value)
{
    std::cout << "array item: ";
    printItem(value);
    std::string n;
    if (value.getString(n) && n == "keep") {
        return false;
    }
    return true;
}